

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void __thiscall
JsonParser_deserialize_map_nested_Test::~JsonParser_deserialize_map_nested_Test
          (JsonParser_deserialize_map_nested_Test *this)

{
  JsonParser_deserialize_map_nested_Test *this_local;
  
  ~JsonParser_deserialize_map_nested_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(JsonParser, deserialize_map_nested) {
	json_parser parser;

	constexpr std::u8string_view json_data = u8R"json({
		"some_text" : "text",
		"some_object" : {
			"some_null_object": {}

		}	,
		"some_other_object" : {
			"beans": {
				"fruit": true
	,			"magical": true	,
				"makes toot": true
			}},
		"some other text":" asdf "
	})json"sv;

	object obj = parser.deserialize(json_data);
	EXPECT_EQ(obj.size(), 4U);
	EXPECT_EQ(obj[u8"some_text"], u8"text");
	EXPECT_EQ(obj[u8"some other text"], u8" asdf ");

	// some_object
	EXPECT_FALSE(obj[u8"some_object"].null());
	EXPECT_EQ(obj[u8"some_object"].size(), 1U);
	EXPECT_FALSE(obj[u8"some_object"][u8"some_null_object"].null());
	EXPECT_EQ(obj[u8"some_object"][u8"some_null_object"].size(), 0U);

	// some_other_object
	EXPECT_FALSE(obj[u8"some_other_object"].null());
	EXPECT_EQ(obj[u8"some_other_object"].size(), 1U);
	EXPECT_FALSE(obj[u8"some_other_object"][u8"beans"].null());
	EXPECT_EQ(obj[u8"some_other_object"][u8"beans"].size(), 3U);
	EXPECT_EQ(obj[u8"some_other_object"][u8"beans"][u8"fruit"], true);
	EXPECT_EQ(obj[u8"some_other_object"][u8"beans"][u8"magical"], true);
	EXPECT_EQ(obj[u8"some_other_object"][u8"beans"][u8"makes toot"], true);
}